

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

IndexStack *
libcellml::rebaseIndexStack
          (IndexStack *__return_storage_ptr__,IndexStack *stack,IndexStack *originStack,
          IndexStack *destinationStack)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  int iVar2;
  value_type_conflict1 local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__,stack);
  local_38 = 0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (__return_storage_ptr__,
             (long)(originStack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(originStack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_38);
  __s1 = (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
         ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __s2 = (originStack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if ((long)puVar1 - (long)__s1 ==
      (long)(originStack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_finish - (long)__s2) {
    if (puVar1 != __s1) {
      iVar2 = bcmp(__s1,__s2,(long)puVar1 - (long)__s1);
      if (iVar2 != 0) goto LAB_00259ef1;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (__return_storage_ptr__,destinationStack);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (long)(originStack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_finish +
               ((long)(stack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start -
               (long)(originStack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_start),
               (stack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  else {
LAB_00259ef1:
    if (puVar1 != __s1) {
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_finish = __s1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IndexStack rebaseIndexStack(const IndexStack &stack, const IndexStack &originStack, const IndexStack &destinationStack)
{
    auto rebasedStack = stack;

    rebasedStack.resize(originStack.size(), SIZE_MAX);
    if (rebasedStack == originStack) {
        rebasedStack = destinationStack;
        auto offsetIt = stack.begin() + ptrdiff_t(originStack.size());
        rebasedStack.insert(rebasedStack.end(), offsetIt, stack.end());
    } else {
        rebasedStack.clear();
    }

    return rebasedStack;
}